

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.h
# Opt level: O2

const_iterator __thiscall QAssociativeIterable::constBegin(QAssociativeIterable *this)

{
  undefined8 uVar1;
  void *extraout_RDX;
  long in_FS_OFFSET;
  const_iterator cVar2;
  undefined1 local_38 [24];
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QIterable<QMetaAssociation>::constBegin((QIterable<QMetaAssociation> *)local_38);
  uVar1 = local_38._8_8_;
  local_38._16_8_ = local_38._0_8_;
  local_38._8_8_ = 0;
  *(undefined8 *)&this->super_QIterable<QMetaAssociation> = local_38._0_8_;
  (this->super_QIterable<QMetaAssociation>).m_iterable.m_pointer.d = uVar1;
  local_20 = 0;
  QBaseIterator<QMetaAssociation>::~QBaseIterator
            ((QBaseIterator<QMetaAssociation> *)(local_38 + 0x10));
  QBaseIterator<QMetaAssociation>::~QBaseIterator((QBaseIterator<QMetaAssociation> *)local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterator = extraout_RDX;
    cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
    super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d =
         (QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
          )(QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
            )this;
    return (const_iterator)
           cVar2.super_QAssociativeConstIterator.super_QConstIterator<QMetaAssociation>.
           super_QBaseIterator<QMetaAssociation>;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constBegin() const { return const_iterator(QIterable::constBegin()); }